

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_pack_hdu(fitsfile *infptr,fitsfile *outfptr,undefined4 *param_3,int *param_4,
               undefined8 param_5,undefined8 param_6,undefined8 param_7,undefined8 param_8,
               undefined8 param_9,float param_10,undefined8 param_11,float param_12)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  undefined8 in_stack_00000080;
  int in_stack_00000088;
  int stat;
  int bitpix;
  int naxis;
  fitsfile *tempfile;
  int hdutype;
  int hdunum;
  int tstatus;
  double local_338;
  undefined8 uStack_330;
  double bscale;
  long datastart;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  long naxes [9];
  char fzalgor [71];
  char outfits [513];
  
  plVar3 = &DAT_001bdcb0;
  plVar4 = naxes;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *plVar4 = *plVar3;
    plVar3 = plVar3 + 1;
    plVar4 = plVar4 + 1;
  }
  stat = 0;
  naxis = 0;
  if (*param_4 != 0) {
    return 0;
  }
  ffghdt(infptr,&hdutype,&stat);
  if (hdutype == 0) {
    ffgipr(infptr,9,&bitpix,&naxis,naxes,&stat);
    iVar1 = 1;
    for (lVar2 = 0; lVar2 != 9; lVar2 = lVar2 + 1) {
      iVar1 = iVar1 * (int)naxes[lVar2];
    }
    bVar5 = iVar1 != 0;
  }
  else {
    bVar5 = false;
  }
  tstatus = 0;
  iVar1 = ffgky(infptr,0x10,"FZALGOR",fzalgor,(char *)0x0,&tstatus);
  if ((iVar1 != 0) ||
     ((iVar1 = bcmp(fzalgor,"NONE",5), iVar1 != 0 && (iVar1 = bcmp(fzalgor,"none",5), iVar1 != 0))))
  {
    if ((hdutype == 2) && (in_stack_00000088 != 0)) {
      ffghad(infptr,(long *)outfits,&datastart,(long *)&tempfile,param_4);
      if (0xb40 < (long)tempfile - datastart) {
        fits_compress_table(infptr,outfptr,&stat);
        goto LAB_00109adb;
      }
    }
    else {
      iVar1 = fits_is_compressed_image(infptr,&stat);
      if (((bool)((naxis != 0 && (iVar1 == 0 && hdutype == 0)) & bVar5)) &&
         (in_stack_00000080._4_4_ != 0)) {
        if (bitpix - 1U < 0x3f && param_10 != 0.0) {
          local_338 = (double)CONCAT44(local_338._4_4_,param_10);
          tstatus = 0;
          ffgky(infptr,0x52,"BSCALE",&bscale,(char *)0x0,&tstatus);
          if ((tstatus != 0) || ((bscale == 1.0 && (!NAN(bscale))))) goto LAB_00109c32;
          if (bitpix == 0x20) {
            fp_i4stat(infptr,naxis,naxes,(imgstats *)&datastart,&stat);
          }
          else {
            fp_i2stat(infptr,naxis,naxes,(imgstats *)&datastart,&stat);
          }
          dVar6 = local_2f0;
          if (local_2f0 == 0.0 || local_2e8 <= local_2f0) {
            dVar6 = local_2e8;
          }
          dVar9 = local_2e0;
          if (local_2e0 == 0.0 || dVar6 <= local_2e0) {
            dVar9 = dVar6;
          }
          if (dVar9 / (double)local_338._0_4_ <= 1.0) goto LAB_00109c32;
          uStack_330 = 0;
          local_338 = dVar9 / (double)local_338._0_4_;
          ffflnm(outfptr,outfits,&stat);
          fp_tmpnam("Tmp3",outfits,tempfilename3);
          ffinit(&tempfile,tempfilename3,&stat);
          ffghdn(infptr,&hdunum);
          if (hdunum != 1) {
            ffcrim(tempfile,8,0,naxes,&stat);
          }
          ffcphd(infptr,tempfile,&stat);
          if (bitpix == 0x20) {
            fp_i4rescale(infptr,naxis,naxes,local_338,tempfile,&stat);
          }
          else {
            fp_i2rescale(infptr,naxis,naxes,local_338,tempfile,&stat);
          }
          bscale = local_338 * bscale;
          ffuky(tempfile,0x52,"BSCALE",&bscale,(char *)0x0,&stat);
          ffrdef(tempfile,&stat);
          fits_img_compress(tempfile,outfptr,&stat);
          ffdelt(tempfile,&stat);
          tempfilename3[0] = '\0';
        }
        else {
LAB_00109c32:
          if ((0 < bitpix) && ((int)param_11 != 0)) {
            if ((uint)bitpix < 0x20) {
              fp_i2stat(infptr,naxis,naxes,(imgstats *)&datastart,&stat);
            }
            else {
              fp_i4stat(infptr,naxis,naxes,(imgstats *)&datastart,&stat);
            }
            ffrhdu(infptr,&hdutype,&stat);
            uVar7 = SUB84(local_2f0,0);
            uVar8 = (undefined4)((ulong)local_2f0 >> 0x20);
            if (local_2f0 == 0.0 || local_2e8 <= local_2f0) {
              uVar7 = SUB84(local_2e8,0);
              uVar8 = (undefined4)((ulong)local_2e8 >> 0x20);
            }
            if (local_2e0 == 0.0 || (double)CONCAT44(uVar8,uVar7) <= local_2e0) {
              local_2e0 = (double)CONCAT44(uVar8,uVar7);
            }
            if ((local_2e0 < (double)(param_11._4_4_ * param_7._4_4_)) ||
               (local_2e8 < (double)param_12)) {
              fits_set_lossy_int(outfptr,0,&stat);
              ffghdn(infptr,&hdunum);
              printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
                     ,(ulong)(uint)hdunum);
            }
            else {
              *param_3 = 0;
            }
          }
          fits_img_compress(infptr,outfptr,&stat);
          if ((-1 < bitpix) &&
             (((int)param_7 != 0x29 || ((param_9._4_4_ == 0.0 && (!NAN(param_9._4_4_)))))))
          goto LAB_00109adb;
        }
        *param_3 = 0;
        goto LAB_00109adb;
      }
    }
  }
  ffcopy(infptr,outfptr,0,&stat);
LAB_00109adb:
  *param_4 = stat;
  return 0;
}

Assistant:

int fp_pack_hdu (fitsfile *infptr, fitsfile *outfptr, fpstate fpvar,
   int *islossless, int *status)
{
	fitsfile *tempfile;
	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix;
	int	tstatus, hdunum;
	double  bscale, rescale;

	char	outfits[SZ_STR], fzalgor[FLEN_VALUE];
	long 	headstart, datastart, dataend, datasize;
	double  noisemin;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	if (*status) return(0);

	fits_get_hdu_type (infptr, &hdutype, &stat);

	if (hdutype == IMAGE_HDU) {
	    fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, &stat);
	    for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	}

	/* check directive keyword to see if this HDU should not be compressed */
        tstatus = 0;
        if (!fits_read_key(infptr, TSTRING, "FZALGOR", fzalgor, NULL, &tstatus) ) {
	    if (!strcmp(fzalgor, "NONE") || !strcmp(fzalgor, "none") ) {
 	        fits_copy_hdu (infptr, outfptr, 0, &stat);

	        *status = stat;
	        return(0);
            }
	}

        /* =============================================================== */
        /* This block is only for  binary table compression */
	if (hdutype == BINARY_TBL && fpvar.do_tables) { 

	    fits_get_hduaddr(infptr, &headstart, &datastart, &dataend, status); 
	    datasize = dataend - datastart;

	    if (datasize <= 2880) {
		/* data is less than 1 FITS block in size, so don't compress */
	        fits_copy_hdu (infptr, outfptr, 0, &stat);
	    } else {
		    fits_compress_table (infptr, outfptr, &stat);
	    }

	    *status = stat;
	    return(0);
	}
        /* =============================================================== */

        /* If this is not a non-null image HDU, just copy it verbatim */
	if (fits_is_compressed_image (infptr,  &stat) || hdutype != IMAGE_HDU ||
	    naxis == 0 || totpix == 0 || !fpvar.do_images) {
	        fits_copy_hdu (infptr, outfptr, 0, &stat);

	} else {  /* remaining code deals only with IMAGE HDUs */

		/* special case: rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(infptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);
		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in output directory */
			  
			  /* create temporary file name */
			  fits_file_name(outfptr, outfits, &stat);  /* get the output file name */
			  fp_tmpnam("Tmp3", outfits, tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(infptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(infptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(infptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(infptr, naxis, naxes, rescale, tempfile, &stat);


			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

		          fits_img_compress (tempfile, outfptr, &stat);
		          fits_delete_file  (tempfile, &stat);
		          tempfilename3[0] = '\0';   /* clear the temp filename */
		          *islossless = 0;  /* used a lossy compression method */

	                  *status = stat;
	                  return(0);
			}
		   }
		}

		/* if requested to do lossy compression of integer images (by */
		/* converting to float), then check if this HDU qualifies */
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {
		    
			if (bitpix >= LONG_IMG)
			  fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);

			/* rescan the image header to reset scaling values (changed by fp_iNstat) */
			ffrhdu(infptr, &hdutype, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (imagestats.noise3 < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);

			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);

			} else {
			    /* compressed image is not identical to original */
			    *islossless = 0;
			}  
		}

                /* finally, do the actual image compression */
		fits_img_compress (infptr, outfptr, &stat);

		if (bitpix < 0 || 
		    (fpvar.comptype == HCOMPRESS_1 && fpvar.scale != 0.)) {

		    /* compressed image is not identical to original */
		    *islossless = 0;  
		}
	}

	*status = stat;
	return(0);
}